

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEObserver.cpp
# Opt level: O0

bool __thiscall test_CEObserver::test_constructor(test_CEObserver *this)

{
  byte bVar1;
  long *in_RDI;
  CEObserver test3;
  CEObserver test2;
  CEObserver test1;
  double in_stack_fffffffffffff840;
  CEObserver *this_00;
  CEObserver *in_stack_fffffffffffff868;
  CEObserver *in_stack_fffffffffffff870;
  allocator *paVar2;
  undefined4 local_618;
  undefined1 local_611 [33];
  double local_5f0;
  double local_5e8;
  undefined4 local_5e0;
  allocator local_5d9;
  string local_5d8 [32];
  double local_5b8;
  double local_5b0;
  undefined4 local_5a8;
  allocator local_5a1;
  string local_5a0 [32];
  double local_580;
  double local_578;
  undefined4 local_570;
  allocator local_569;
  string local_568 [32];
  double local_548;
  double local_540;
  undefined4 local_538;
  allocator local_531;
  string local_530 [32];
  double local_510;
  double local_508;
  undefined4 local_500;
  allocator local_4f9;
  string local_4f8 [32];
  double local_4d8;
  double local_4d0;
  CEObserver local_4c8;
  undefined4 local_418;
  allocator local_411;
  string local_410 [32];
  double local_3f0;
  double local_3e8;
  undefined4 local_3e0;
  allocator local_3d9;
  string local_3d8 [32];
  double local_3b8;
  double local_3b0;
  undefined4 local_3a8;
  allocator local_3a1;
  string local_3a0 [32];
  double local_380;
  double local_378;
  undefined4 local_370;
  allocator local_369;
  string local_368 [32];
  double local_348;
  double local_340;
  undefined4 local_338;
  allocator local_331;
  string local_330 [32];
  double local_310;
  double local_308;
  undefined4 local_300;
  allocator local_2f9;
  string local_2f8 [32];
  double local_2d8;
  double local_2d0;
  CEObserver local_2c8;
  undefined4 local_218;
  allocator local_211;
  string local_210 [32];
  undefined8 local_1f0;
  double local_1e8;
  undefined4 local_1e0;
  allocator local_1d9;
  string local_1d8 [32];
  undefined8 local_1b8;
  double local_1b0;
  undefined4 local_1a8;
  allocator local_1a1;
  string local_1a0 [32];
  double local_180;
  double local_178;
  undefined4 local_170;
  allocator local_169;
  string local_168 [32];
  double local_148;
  double local_140;
  undefined4 local_138;
  allocator local_131;
  string local_130 [32];
  undefined8 local_110;
  double local_108;
  undefined4 local_100;
  allocator local_f9;
  string local_f8 [32];
  undefined8 local_d8 [3];
  double local_c0;
  CEObserver local_b8;
  
  CEObserver::CEObserver(in_stack_fffffffffffff870);
  local_c0 = CEObserver::Longitude_Rad(&local_b8);
  local_d8[0] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"test_constructor",&local_f9);
  local_100 = 0x51;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_c0,local_d8,local_f8,&local_100);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_108 = CEObserver::Latitude_Rad(&local_b8);
  local_110 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"test_constructor",&local_131);
  local_138 = 0x52;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_108,&local_110,local_130,&local_138);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  local_140 = CEObserver::Temperature_C(&local_b8);
  local_148 = CppEphem::SeaLevelTemp_C();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"test_constructor",&local_169);
  local_170 = 0x53;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_140,&local_148,local_168,&local_170);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  local_178 = CEObserver::Pressure_hPa(&local_b8);
  CEObserver::Elevation_m(&local_b8);
  local_180 = CppEphem::EstimatePressure_hPa(in_stack_fffffffffffff840);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"test_constructor",&local_1a1);
  local_1a8 = 0x54;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_178,&local_180,local_1a0,&local_1a8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  local_1b0 = CEObserver::RelativeHumidity(&local_b8);
  local_1b8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"test_constructor",&local_1d9);
  local_1e0 = 0x55;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1b0,&local_1b8,local_1d8,&local_1e0);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  local_1e8 = CEObserver::Wavelength_um(&local_b8);
  local_1f0 = 0x3fe0000000000000;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"test_constructor",&local_211);
  local_218 = 0x56;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_1e8,&local_1f0,local_210,&local_218);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  CEObserver::CEObserver(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_2d0 = CEObserver::Longitude_Rad(&local_2c8);
  local_2d8 = CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"test_constructor",&local_2f9);
  local_300 = 0x5a;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_2d0,&local_2d8,local_2f8,&local_300);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  local_308 = CEObserver::Latitude_Rad(&local_2c8);
  local_310 = CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"test_constructor",&local_331);
  local_338 = 0x5b;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_308,&local_310,local_330,&local_338);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  local_340 = CEObserver::Temperature_K((CEObserver *)0x11d814);
  local_348 = CEObserver::Temperature_K((CEObserver *)0x11d845);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_368,"test_constructor",&local_369);
  local_370 = 0x5c;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_340,&local_348,local_368,&local_370);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  local_378 = CEObserver::Pressure_hPa(&local_2c8);
  local_380 = CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a0,"test_constructor",&local_3a1);
  local_3a8 = 0x5d;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_378,&local_380,local_3a0,&local_3a8);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
  local_3b0 = CEObserver::RelativeHumidity(&local_2c8);
  local_3b8 = CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"test_constructor",&local_3d9);
  local_3e0 = 0x5e;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_3b0,&local_3b8,local_3d8,&local_3e0);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  local_3e8 = CEObserver::Wavelength_um(&local_2c8);
  local_3f0 = CEObserver::Wavelength_um((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"test_constructor",&local_411);
  local_418 = 0x5f;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_3e8,&local_3f0,local_410,&local_418);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  CEObserver::CEObserver(in_stack_fffffffffffff870,in_stack_fffffffffffff868);
  local_4d0 = CEObserver::Longitude_Rad(&local_4c8);
  local_4d8 = CEObserver::Longitude_Rad((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"test_constructor",&local_4f9);
  local_500 = 99;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_4d0,&local_4d8,local_4f8,&local_500);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  local_508 = CEObserver::Latitude_Rad(&local_4c8);
  local_510 = CEObserver::Latitude_Rad((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_530,"test_constructor",&local_531);
  local_538 = 100;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_508,&local_510,local_530,&local_538);
  std::__cxx11::string::~string(local_530);
  std::allocator<char>::~allocator((allocator<char> *)&local_531);
  local_540 = CEObserver::Temperature_K((CEObserver *)0x11dd84);
  local_548 = CEObserver::Temperature_K((CEObserver *)0x11ddaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_568,"test_constructor",&local_569);
  local_570 = 0x65;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_540,&local_548,local_568,&local_570);
  std::__cxx11::string::~string(local_568);
  std::allocator<char>::~allocator((allocator<char> *)&local_569);
  local_578 = CEObserver::Pressure_hPa(&local_4c8);
  local_580 = CEObserver::Pressure_hPa((CEObserver *)(in_RDI + 0x44));
  paVar2 = &local_5a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"test_constructor",paVar2);
  local_5a8 = 0x66;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_578,&local_580,local_5a0,&local_5a8);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  local_5b0 = CEObserver::RelativeHumidity(&local_4c8);
  local_5b8 = CEObserver::RelativeHumidity((CEObserver *)(in_RDI + 0x44));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"test_constructor",&local_5d9);
  local_5e0 = 0x67;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_5b0,&local_5b8,local_5d8,&local_5e0);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  local_5e8 = CEObserver::Wavelength_um(&local_4c8);
  local_5f0 = CEObserver::Wavelength_um((CEObserver *)(in_RDI + 0x44));
  this_00 = (CEObserver *)local_611;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_611 + 1),"test_constructor",(allocator *)this_00);
  local_618 = 0x68;
  (**(code **)(*in_RDI + 0x58))(in_RDI,&local_5e8,&local_5f0,local_611 + 1,&local_618);
  std::__cxx11::string::~string((string *)(local_611 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_611);
  bVar1 = (**(code **)(*in_RDI + 0x18))();
  CEObserver::~CEObserver(this_00);
  CEObserver::~CEObserver(this_00);
  CEObserver::~CEObserver(this_00);
  return (bool)(bVar1 & 1);
}

Assistant:

bool test_CEObserver::test_constructor(void)
{
    // Default constructor
    CEObserver test1;
    test_double(test1.Longitude_Rad(), 0.0, __func__, __LINE__);
    test_double(test1.Latitude_Rad(),  0.0,  __func__, __LINE__);
    test_double(test1.Temperature_C(), CppEphem::SeaLevelTemp_C(), __func__, __LINE__);
    test_double(test1.Pressure_hPa(),  CppEphem::EstimatePressure_hPa(test1.Elevation_m()),  __func__, __LINE__);
    test_double(test1.RelativeHumidity(), 0.0, __func__, __LINE__);
    test_double(test1.Wavelength_um(), 0.5, __func__, __LINE__);

    // Create a copy for testing
    CEObserver test2(base_obs_);
    test_double(test2.Longitude_Rad(), base_obs_.Longitude_Rad(), __func__, __LINE__);
    test_double(test2.Latitude_Rad(),  base_obs_.Latitude_Rad(),  __func__, __LINE__);
    test_double(test2.Temperature_K(), base_obs_.Temperature_K(), __func__, __LINE__);
    test_double(test2.Pressure_hPa(),  base_obs_.Pressure_hPa(),  __func__, __LINE__);
    test_double(test2.RelativeHumidity(), base_obs_.RelativeHumidity(), __func__, __LINE__);
    test_double(test2.Wavelength_um(), base_obs_.Wavelength_um(), __func__, __LINE__);

    // Copy assignment operator
    CEObserver test3 = base_obs_;
    test_double(test3.Longitude_Rad(), base_obs_.Longitude_Rad(), __func__, __LINE__);
    test_double(test3.Latitude_Rad(),  base_obs_.Latitude_Rad(),  __func__, __LINE__);
    test_double(test3.Temperature_K(), base_obs_.Temperature_K(), __func__, __LINE__);
    test_double(test3.Pressure_hPa(),  base_obs_.Pressure_hPa(),  __func__, __LINE__);
    test_double(test3.RelativeHumidity(), base_obs_.RelativeHumidity(), __func__, __LINE__);
    test_double(test3.Wavelength_um(), base_obs_.Wavelength_um(), __func__, __LINE__);

    return pass();
}